

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.inc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::cpp_unittest::GeneratedMessageTest_SerializationToStream_Test::
TestBody(GeneratedMessageTest_SerializationToStream_Test *this)

{
  bool bVar1;
  size_t sVar2;
  void *data_00;
  char *pcVar3;
  char *in_R9;
  string local_7f8;
  AssertHelper local_7d8;
  Message local_7d0;
  string_view local_7c8;
  bool local_7b1;
  undefined1 local_7b0 [8];
  AssertionResult gtest_ar__1;
  Message local_798;
  int local_78c;
  undefined1 local_788 [8];
  AssertionResult gtest_ar;
  AssertHelper local_758;
  Message local_750;
  bool local_741;
  undefined1 local_740 [8];
  AssertionResult gtest_ar_;
  CodedOutputStream output_stream;
  ArrayOutputStream array_stream;
  string data;
  int size;
  undefined1 local_690 [8];
  TestAllTypes message2;
  TestAllTypes message1;
  GeneratedMessageTest_SerializationToStream_Test *this_local;
  
  proto2_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)((long)&message2.field_0 + 0x328));
  proto2_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)local_690);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>
            ((TestAllTypes *)((long)&message2.field_0 + 0x328));
  sVar2 = proto2_unittest::TestAllTypes::ByteSizeLong
                    ((TestAllTypes *)((long)&message2.field_0 + 0x328));
  data.field_2._8_4_ = (undefined4)sVar2;
  std::__cxx11::string::string((string *)&array_stream.position_);
  std::__cxx11::string::resize((ulong)&array_stream.position_);
  data_00 = (void *)std::__cxx11::string::operator[]((ulong)&array_stream.position_);
  protobuf::io::ArrayOutputStream::ArrayOutputStream
            ((ArrayOutputStream *)&output_stream.start_count_,data_00,data.field_2._8_4_,1);
  protobuf::io::CodedOutputStream::CodedOutputStream<google::protobuf::io::ArrayOutputStream,void>
            ((CodedOutputStream *)&gtest_ar_.message_,
             (ArrayOutputStream *)&output_stream.start_count_);
  protobuf::MessageLite::SerializeWithCachedSizes
            ((MessageLite *)((long)&message2.field_0 + 0x328),
             (CodedOutputStream *)&gtest_ar_.message_);
  bVar1 = protobuf::io::CodedOutputStream::HadError((CodedOutputStream *)&gtest_ar_.message_);
  local_741 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_740,&local_741,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_740);
  if (!bVar1) {
    testing::Message::Message(&local_750);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_740,
               (AssertionResult *)"output_stream.HadError()","true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_758,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x2a1,pcVar3);
    testing::internal::AssertHelper::operator=(&local_758,&local_750);
    testing::internal::AssertHelper::~AssertHelper(&local_758);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_750);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_740);
  local_78c = protobuf::io::CodedOutputStream::ByteCount((CodedOutputStream *)&gtest_ar_.message_);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_788,"size","output_stream.ByteCount()",
             (int *)(data.field_2._M_local_buf + 8),&local_78c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_788);
  if (!bVar1) {
    testing::Message::Message(&local_798);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_788);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x2a2,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_798);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_798);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_788);
  protobuf::io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)&gtest_ar_.message_);
  protobuf::io::ArrayOutputStream::~ArrayOutputStream
            ((ArrayOutputStream *)&output_stream.start_count_);
  local_7c8 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)&array_stream.position_);
  local_7b1 = protobuf::MessageLite::ParseFromString((MessageLite *)local_690,local_7c8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_7b0,&local_7b1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7b0);
  if (!bVar1) {
    testing::Message::Message(&local_7d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_7f8,(internal *)local_7b0,(AssertionResult *)"message2.ParseFromString(data)",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_7d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x2a4,pcVar3);
    testing::internal::AssertHelper::operator=(&local_7d8,&local_7d0);
    testing::internal::AssertHelper::~AssertHelper(&local_7d8);
    std::__cxx11::string::~string((string *)&local_7f8);
    testing::Message::~Message(&local_7d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7b0);
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>((TestAllTypes *)local_690);
  std::__cxx11::string::~string((string *)&array_stream.position_);
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)local_690);
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)((long)&message2.field_0 + 0x328));
  return;
}

Assistant:

TEST(GENERATED_MESSAGE_TEST_NAME, SerializationToStream) {
  UNITTEST::TestAllTypes message1, message2;
  TestUtil::SetAllFields(&message1);
  int size = message1.ByteSizeLong();
  std::string data;
  data.resize(size);
  {
    // Allow the output stream to buffer only one byte at a time.
    io::ArrayOutputStream array_stream(&data[0], size, 1);
    io::CodedOutputStream output_stream(&array_stream);
    message1.SerializeWithCachedSizes(&output_stream);
    EXPECT_FALSE(output_stream.HadError());
    EXPECT_EQ(size, output_stream.ByteCount());
  }
  EXPECT_TRUE(message2.ParseFromString(data));
  TestUtil::ExpectAllFieldsSet(message2);

}